

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void CChat::ConSayTeam(IResult *pResult,void *pUserData)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  Say((CChat *)pUserData,2,(char *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void CChat::ConSayTeam(IConsole::IResult *pResult, void *pUserData)
{
	((CChat*)pUserData)->Say(CHAT_TEAM, pResult->GetString(0));
}